

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.hh
# Opt level: O2

int4 __thiscall TypePointer::compareDependency(TypePointer *this,Datatype *op)

{
  type_metatype tVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = op->size - (this->super_Datatype).size;
  if (uVar2 == 0) {
    tVar1 = (this->super_Datatype).metatype;
    if (tVar1 != op->metatype) {
      return (uint)((int)op->metatype <= (int)tVar1) * 2 + -1;
    }
    if (this->wordsize == op[1].size) {
      if (this->ptrto == (Datatype *)op[1]._vptr_Datatype) {
        return 0;
      }
      bVar3 = this->ptrto < (Datatype *)op[1]._vptr_Datatype;
    }
    else {
      bVar3 = this->wordsize < (uint)op[1].size;
    }
    uVar2 = -(uint)bVar3 | 1;
  }
  return uVar2;
}

Assistant:

uint8 getId(void) const { return id; }